

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator-=(TPZFMatrix<Fad<float>_> *this,Fad<float> *val)

{
  int iVar1;
  float *pfVar2;
  TPZFMatrix<Fad<float>_> *pTVar3;
  int i;
  long lVar4;
  long lVar5;
  Fad<float> local_38;
  
  local_38.val_ = -val->val_;
  iVar1 = (val->dx_).num_elts;
  lVar5 = (long)iVar1;
  local_38.dx_.num_elts = 0;
  local_38.dx_.ptr_to_data = (float *)0x0;
  if (0 < lVar5) {
    local_38.dx_.num_elts = iVar1;
    local_38.dx_.ptr_to_data = (float *)operator_new__(lVar5 * 4);
    pfVar2 = (val->dx_).ptr_to_data;
    lVar4 = 0;
    do {
      local_38.dx_.ptr_to_data[lVar4] = -pfVar2[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  local_38.defaultVal = 0.0;
  pTVar3 = operator+=(this,&local_38);
  Fad<float>::~Fad(&local_38);
  return pTVar3;
}

Assistant:

TPZFMatrix<TVar> &operator-=(const TVar val )  { return operator+=( -val ); }